

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O2

bool Imath_3_2::extractSHRT<float>
               (Matrix33<float> *mat,Vec2<float> *s,float *h,float *r,Vec2<float> *t,bool exc)

{
  bool bVar1;
  Matrix33<float> local_58;
  
  local_58.x[0][0] = 1.0;
  local_58.x[0][1] = 0.0;
  local_58.x[0][2] = 0.0;
  local_58.x[1][0] = 0.0;
  local_58.x[1][1] = 1.0;
  local_58.x[1][2] = 0.0;
  local_58.x[2][0] = 0.0;
  local_58.x[2][1] = 0.0;
  local_58.x[2][2] = 1.0;
  Matrix33<float>::operator=(&local_58,mat);
  bVar1 = extractAndRemoveScalingAndShear<float>(&local_58,s,h,exc);
  if (bVar1) {
    extractEuler<float>(&local_58,r);
    t->x = mat->x[2][0];
    t->y = mat->x[2][1];
  }
  return bVar1;
}

Assistant:

bool
extractSHRT (
    const Matrix33<T>& mat, Vec2<T>& s, T& h, T& r, Vec2<T>& t, bool exc)
{
    Matrix33<T> rot;

    rot = mat;
    if (!extractAndRemoveScalingAndShear (rot, s, h, exc)) return false;

    extractEuler (rot, r);

    t.x = mat[2][0];
    t.y = mat[2][1];

    return true;
}